

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O3

_Bool extract_if_dead(connectdata *conn,Curl_easy *data)

{
  long lVar1;
  undefined1 auVar2 [12];
  undefined8 uVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  uint uVar7;
  int iVar8;
  timediff_t tVar9;
  char *fmt;
  curltime cVar10;
  curltime newer;
  curltime older;
  curltime older_00;
  
  if ((conn->easyq).size != 0) {
    return false;
  }
  cVar10 = Curl_now();
  uVar3 = (conn->lastused).tv_sec;
  uVar4 = (conn->lastused).tv_usec;
  older.tv_usec = uVar4;
  older.tv_sec = uVar3;
  auVar2 = cVar10._0_12_;
  cVar10._12_4_ = 0;
  cVar10.tv_sec = auVar2._0_8_;
  cVar10.tv_usec = auVar2._8_4_;
  older._12_4_ = 0;
  tVar9 = Curl_timediff(cVar10,older);
  if ((data->set).maxage_conn < tVar9 / 1000) {
    fmt = "Too old connection (%ld seconds idle), disconnect it";
  }
  else {
    uVar5 = (conn->created).tv_sec;
    uVar6 = (conn->created).tv_usec;
    older_00.tv_usec = uVar6;
    older_00.tv_sec = uVar5;
    newer._12_4_ = 0;
    newer.tv_sec = auVar2._0_8_;
    newer.tv_usec = auVar2._8_4_;
    older_00._12_4_ = 0;
    tVar9 = Curl_timediff(newer,older_00);
    lVar1 = (data->set).maxlifetime_conn;
    if ((lVar1 == 0) || (tVar9 / 1000 <= lVar1)) {
      if (conn->handler->connection_check == (_func_uint_Curl_easy_ptr_connectdata_ptr_uint *)0x0) {
        iVar8 = Curl_socket_check(conn->sock[0],-1,-1,0);
        if (iVar8 == 0) {
          return false;
        }
      }
      else {
        Curl_attach_connection(data,conn);
        uVar7 = (*conn->handler->connection_check)(data,conn,1);
        Curl_detach_connection(data);
        if ((uVar7 & 1) == 0) {
          return false;
        }
      }
      goto LAB_005eb618;
    }
    fmt = "Too old connection (%ld seconds since creation), disconnect it";
  }
  Curl_infof(data,fmt);
LAB_005eb618:
  Curl_infof(data,"Connection %ld seems to be dead",conn->connection_id);
  Curl_conncache_remove_conn(data,conn,false);
  return true;
}

Assistant:

static bool extract_if_dead(struct connectdata *conn,
                            struct Curl_easy *data)
{
  if(!CONN_INUSE(conn)) {
    /* The check for a dead socket makes sense only if the connection isn't in
       use */
    bool dead;
    struct curltime now = Curl_now();
    if(conn_maxage(data, conn, now)) {
      /* avoid check if already too old */
      dead = TRUE;
    }
    else if(conn->handler->connection_check) {
      /* The protocol has a special method for checking the state of the
         connection. Use it to check if the connection is dead. */
      unsigned int state;

      /* briefly attach the connection to this transfer for the purpose of
         checking it */
      Curl_attach_connection(data, conn);

      state = conn->handler->connection_check(data, conn, CONNCHECK_ISDEAD);
      dead = (state & CONNRESULT_DEAD);
      /* detach the connection again */
      Curl_detach_connection(data);

    }
    else {
      /* Use the general method for determining the death of a connection */
      dead = SocketIsDead(conn->sock[FIRSTSOCKET]);
    }

    if(dead) {
      infof(data, "Connection %ld seems to be dead", conn->connection_id);
      Curl_conncache_remove_conn(data, conn, FALSE);
      return TRUE;
    }
  }
  return FALSE;
}